

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

SplittingStepCoefficients
SplittingStepCoefficients_Alloc(int sequential_methods,int stages,int partitions)

{
  sunrealtype *psVar1;
  sunrealtype ***pppsVar2;
  void *pvVar3;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int j;
  int i_1;
  sunrealtype *beta_mem;
  int i;
  sunrealtype **beta_cols;
  SplittingStepCoefficients coefficients;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  int local_2c;
  SplittingStepCoefficients local_8;
  
  if (((in_EDI < 1) || (in_ESI < 1)) || (in_EDX < 1)) {
    local_8 = (SplittingStepCoefficients)0x0;
  }
  else {
    local_8 = (SplittingStepCoefficients)malloc(0x20);
    if (local_8 == (SplittingStepCoefficients)0x0) {
      local_8 = (SplittingStepCoefficients)0x0;
    }
    else {
      local_8->sequential_methods = in_EDI;
      local_8->stages = in_ESI;
      local_8->partitions = in_EDX;
      local_8->order = 0;
      psVar1 = (sunrealtype *)calloc((long)in_EDI,8);
      local_8->alpha = psVar1;
      if (local_8->alpha == (sunrealtype *)0x0) {
        SplittingStepCoefficients_Destroy
                  ((SplittingStepCoefficients *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_8 = (SplittingStepCoefficients)0x0;
      }
      else {
        pppsVar2 = (sunrealtype ***)malloc((long)in_EDI << 3);
        local_8->beta = pppsVar2;
        if (local_8->beta == (sunrealtype ***)0x0) {
          SplittingStepCoefficients_Destroy
                    ((SplittingStepCoefficients *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          local_8 = (SplittingStepCoefficients)0x0;
        }
        else {
          pvVar3 = malloc((long)(in_EDI * (in_ESI + 1)) << 3);
          if (pvVar3 == (void *)0x0) {
            SplittingStepCoefficients_Destroy
                      ((SplittingStepCoefficients *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
            local_8 = (SplittingStepCoefficients)0x0;
          }
          else {
            for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
              local_8->beta[local_2c] =
                   (sunrealtype **)((long)pvVar3 + (long)(local_2c * (in_ESI + 1)) * 8);
            }
            pvVar3 = calloc((long)(in_EDI * (in_ESI + 1) * in_EDX),8);
            if (pvVar3 == (void *)0x0) {
              SplittingStepCoefficients_Destroy
                        ((SplittingStepCoefficients *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
              local_8 = (SplittingStepCoefficients)0x0;
            }
            else {
              for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
                for (iVar4 = 0; iVar4 <= in_ESI; iVar4 = iVar4 + 1) {
                  local_8->beta[iVar5][iVar4] =
                       (sunrealtype *)
                       ((long)pvVar3 + (long)((iVar5 * (in_ESI + 1) + iVar4) * in_EDX) * 8);
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_Alloc(
  const int sequential_methods, const int stages, const int partitions)
{
  if (sequential_methods < 1 || stages < 1 || partitions < 1) { return NULL; }

  SplittingStepCoefficients coefficients =
    (SplittingStepCoefficients)malloc(sizeof(*coefficients));
  if (coefficients == NULL) { return NULL; }

  coefficients->sequential_methods = sequential_methods;
  coefficients->stages             = stages;
  coefficients->partitions         = partitions;
  coefficients->order              = 0;

  coefficients->alpha = (sunrealtype*)calloc(sequential_methods,
                                             sizeof(*coefficients->alpha));
  if (coefficients->alpha == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  /* In order for beta to be indexed like beta[i][j][k], we can't use a single
     malloc. The j index requires allocating a matrix of pointers into beta. The
     i index requires allocating an array of pointers into that matrix. */

  /* Array of pointers for index i */
  coefficients->beta =
    (sunrealtype***)malloc(sequential_methods * sizeof(*coefficients->beta));
  if (coefficients->beta == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  /* Matrix of pointers for index j */
  sunrealtype** beta_cols = (sunrealtype**)malloc(
    sequential_methods * (stages + 1) * sizeof(*beta_cols));
  if (beta_cols == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  for (int i = 0; i < sequential_methods; i++)
  {
    coefficients->beta[i] = &beta_cols[i * (stages + 1)];
  }

  /* Contiguous memory to store the beta tensor -- use calloc so only non-zero
   * coefficients need to be set */
  sunrealtype* beta_mem =
    (sunrealtype*)calloc(sequential_methods * (stages + 1) * partitions,
                         sizeof(*beta_mem));
  if (beta_mem == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  /* Set pointers into the beta tensor */
  for (int i = 0; i < sequential_methods; i++)
  {
    for (int j = 0; j <= stages; j++)
    {
      coefficients->beta[i][j] = &beta_mem[(i * (stages + 1) + j) * partitions];
    }
  }

  return coefficients;
}